

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

arith_uint256 *
CalculateClaimedHeadersWork
          (arith_uint256 *__return_storage_ptr__,
          span<const_CBlockHeader,_18446744073709551615UL> headers)

{
  CBlockHeader *block;
  long lVar1;
  CBlockHeader *header;
  long in_FS_OFFSET;
  CBlockIndex dummy;
  base_uint<256U> bStack_e8;
  CBlockIndex local_c8;
  long local_30;
  
  block = headers._M_ptr;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  base_uint<256U>::base_uint(&__return_storage_ptr__->super_base_uint<256U>,0);
  for (lVar1 = headers._M_extent._M_extent_value._M_extent_value * 0x50; lVar1 != 0;
      lVar1 = lVar1 + -0x50) {
    CBlockIndex::CBlockIndex(&local_c8,block);
    GetBlockProof((arith_uint256 *)&bStack_e8,&local_c8);
    base_uint<256U>::operator+=(&__return_storage_ptr__->super_base_uint<256U>,&bStack_e8);
    block = block + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

arith_uint256 CalculateClaimedHeadersWork(std::span<const CBlockHeader> headers)
{
    arith_uint256 total_work{0};
    for (const CBlockHeader& header : headers) {
        CBlockIndex dummy(header);
        total_work += GetBlockProof(dummy);
    }
    return total_work;
}